

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection.cpp
# Opt level: O3

xcb_window_t __thiscall QXcbConnection::qtSelectionOwner(QXcbConnection *this)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  xcb_window_t xVar3;
  long in_FS_OFFSET;
  QArrayData *local_88;
  QStringBuilder<QLatin1String,_QString> local_68;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  xVar3 = *(xcb_window_t *)(this + 0x420);
  if (xVar3 == 0) {
    puVar1 = *(undefined4 **)
              (*(long *)(*(long *)(this + 0x328) + (long)*(int *)(this + 0x38) * 8) + 8);
    uVar2 = xcb_generate_id(*(undefined8 *)(this + 0x30));
    *(undefined4 *)(this + 0x420) = uVar2;
    xcb_create_window(*(undefined8 *)(this + 0x30),0,uVar2,*puVar1,0,0,3,3,0,1,puVar1[8],0,0);
    xVar3 = *(xcb_window_t *)(this + 0x420);
    QCoreApplication::applicationName();
    local_68.a.m_size = 0x17;
    local_68.a.m_data = "Qt Selection Owner for ";
    local_68.b.d.d = (Data *)local_88;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>(&local_40,&local_68);
    QXcbWindow::setWindowTitle((QXcbConnection *)this,xVar3,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    xVar3 = *(xcb_window_t *)(this + 0x420);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return xVar3;
}

Assistant:

xcb_window_t QXcbConnection::qtSelectionOwner()
{
    if (!m_qtSelectionOwner) {
        xcb_screen_t *xcbScreen = primaryVirtualDesktop()->screen();
        int16_t x = 0, y = 0;
        uint16_t w = 3, h = 3;
        m_qtSelectionOwner = xcb_generate_id(xcb_connection());
        xcb_create_window(xcb_connection(),
                          XCB_COPY_FROM_PARENT,               // depth -- same as root
                          m_qtSelectionOwner,                 // window id
                          xcbScreen->root,                    // parent window id
                          x, y, w, h,
                          0,                                  // border width
                          XCB_WINDOW_CLASS_INPUT_OUTPUT,      // window class
                          xcbScreen->root_visual,             // visual
                          0,                                  // value mask
                          nullptr);                           // value list

        QXcbWindow::setWindowTitle(connection(), m_qtSelectionOwner,
                                   "Qt Selection Owner for "_L1 + QCoreApplication::applicationName());
    }
    return m_qtSelectionOwner;
}